

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O3

void cut_and_splice(TreeNode *n1,TreeNode *n2,int new_x,int new_y,int *x1,int *y1,int *x2,int *y2,
                   TreeNode *e,int n2ton1)

{
  uint uVar1;
  int iVar2;
  TreeNode *pTVar3;
  dl_el_s *pdVar4;
  dl_t paVar5;
  TreeNode *pTVar6;
  TreeNode *pTVar7;
  TreeNode_s *pTVar8;
  dl_el *pdVar9;
  TreeNode *pTVar10;
  int iVar11;
  
  pTVar8 = n1->parent;
  for (pdVar9 = pTVar8->children->first; pdVar9 != (dl_el *)0x0; pdVar9 = pdVar9->next) {
    if ((TreeNode *)pdVar9[1].prev == n1) {
      dl_delete(pTVar8->children,pdVar9);
      break;
    }
  }
  pTVar3 = (TreeNode *)malloc(0x38);
  pTVar3->x = new_x;
  pTVar3->y = new_y;
  pTVar3->mark = curr_mark;
  pTVar3->parent = pTVar8;
  pdVar4 = (dl_el_s *)malloc(0x18);
  if (pdVar4 == (dl_el_s *)0x0) {
    puts("Out of memory!!");
  }
  else {
    pdVar4[1].prev = (dl_el_s *)pTVar3;
    pdVar4->next = (dl_el_s *)0x0;
    paVar5 = pTVar8->children;
    uVar1 = paVar5->count;
    if (uVar1 == 0) {
      pdVar4->prev = (dl_el_s *)0x0;
      paVar5->last = pdVar4;
      paVar5->first = pdVar4;
      paVar5->count = 1;
    }
    else {
      pdVar9 = paVar5->last;
      pdVar4->prev = pdVar9;
      pdVar9->next = pdVar4;
      paVar5->last = pdVar4;
      paVar5->count = uVar1 + 1;
    }
  }
  n1->parent = pTVar3;
  paVar5 = dl_alloc();
  pTVar3->children = paVar5;
  pdVar4 = (dl_el_s *)malloc(0x18);
  if (pdVar4 == (dl_el_s *)0x0) {
    puts("Out of memory!!");
  }
  else {
    pdVar4[1].prev = (dl_el_s *)n1;
    pdVar4->next = (dl_el_s *)0x0;
    uVar1 = paVar5->count;
    if (uVar1 == 0) {
      pdVar4->prev = (dl_el_s *)0x0;
      paVar5->last = pdVar4;
      paVar5->first = pdVar4;
      paVar5->count = 1;
    }
    else {
      pdVar9 = paVar5->last;
      pdVar4->prev = pdVar9;
      pdVar9->next = pdVar4;
      paVar5->last = pdVar4;
      paVar5->count = uVar1 + 1;
    }
  }
  pTVar3->order = -1;
  pTVar3->e = n1->e;
  pTVar3->id = n1->id;
  if (*x1 != n1->x) {
    x2 = x1;
  }
  *x2 = new_x;
  if (*y1 != n1->y) {
    y2 = y1;
  }
  *y2 = new_y;
  pTVar10 = n2;
  if (-1 < n2->order) {
    pTVar10 = n2->parent;
    iVar2 = n2->x;
    if (pTVar10->x == iVar2) {
      iVar11 = n2->y;
      if (pTVar10->y == iVar11) goto LAB_0012ba06;
    }
    else {
      iVar11 = n2->y;
    }
    pTVar6 = (TreeNode *)malloc(0x38);
    pTVar6->mark = curr_mark;
    pTVar6->order = -1;
    pTVar6->id = n2->id;
    pTVar6->x = iVar2;
    pTVar6->y = iVar11;
    pTVar7 = n2->e;
    if (n2->e == n2) {
      pTVar7 = pTVar6;
    }
    pTVar6->e = pTVar7;
    if (e == n2) {
      e = pTVar6;
    }
    pTVar6->len = n2->len;
    pTVar6->blen = n2->blen;
    n2->blen = 0;
    for (pdVar9 = pTVar10->children->first; pdVar9 != (dl_el *)0x0; pdVar9 = pdVar9->next) {
      if ((TreeNode *)pdVar9[1].prev == n2) {
        dl_delete(pTVar10->children,pdVar9);
        break;
      }
    }
    pdVar4 = (dl_el_s *)malloc(0x18);
    if (pdVar4 == (dl_el_s *)0x0) {
      puts("Out of memory!!");
      pTVar8 = n2->parent;
    }
    else {
      pdVar4[1].prev = (dl_el_s *)pTVar6;
      pdVar4->next = (dl_el_s *)0x0;
      pTVar8 = n2->parent;
      paVar5 = pTVar8->children;
      uVar1 = paVar5->count;
      if (uVar1 == 0) {
        pdVar4->prev = (dl_el_s *)0x0;
        paVar5->last = pdVar4;
        paVar5->first = pdVar4;
        paVar5->count = 1;
      }
      else {
        pdVar9 = paVar5->last;
        pdVar4->prev = pdVar9;
        pdVar9->next = pdVar4;
        paVar5->last = pdVar4;
        paVar5->count = uVar1 + 1;
      }
    }
    pTVar6->parent = pTVar8;
    n2->parent = pTVar6;
    paVar5 = dl_alloc();
    pTVar6->children = paVar5;
    pdVar4 = (dl_el_s *)malloc(0x18);
    pTVar10 = pTVar6;
    if (pdVar4 == (dl_el_s *)0x0) {
      puts("Out of memory!!");
    }
    else {
      pdVar4[1].prev = (dl_el_s *)n2;
      pdVar4->next = (dl_el_s *)0x0;
      uVar1 = paVar5->count;
      if (uVar1 == 0) {
        pdVar4->prev = (dl_el_s *)0x0;
        paVar5->last = pdVar4;
        paVar5->first = pdVar4;
        paVar5->count = 1;
      }
      else {
        pdVar9 = paVar5->last;
        pdVar4->prev = pdVar9;
        pdVar9->next = pdVar4;
        paVar5->last = pdVar4;
        paVar5->count = uVar1 + 1;
      }
    }
  }
LAB_0012ba06:
  pTVar7 = pTVar3;
  if (n2ton1 != 0) {
    pTVar7 = pTVar10;
    pTVar10 = pTVar3;
  }
  splice2(pTVar10,pTVar7,e);
  return;
}

Assistant:

void cut_and_splice(TreeNode *n1, TreeNode *n2,
		    DTYPE new_x, DTYPE new_y,
		    DTYPE *x1, DTYPE *y1, DTYPE *x2, DTYPE *y2,
		    TreeNode *e, int n2ton1)
{
  TreeNode *p1, *node, *s;
  
  /* new steiner node */
  p1 = n1->parent;
  remove_child(p1->children, n1);
  node = (TreeNode*)malloc(sizeof(TreeNode));
  node->x = new_x;
  node->y = new_y;
  node->mark = curr_mark;

  node->parent = p1;
  dl_append(TreeNode*, p1->children, node);
  n1->parent = node;
  node->children = dl_alloc();
  dl_append(TreeNode*, node->children, n1);
  node->order = -1;

  node->e = n1->e;
  node->id = n1->id;

  if (*x1==n1->x) {
    *x2 = new_x;
  } else {
    *x1 = new_x;
  }
  if (*y1==n1->y) {
    *y2 = new_y;
  } else {
    *y1 = new_y;
  }

  if (n2->order >= 0) {
    /* n2 is a pin, need to replicate a steiner node */
    s = n2->parent;
    if (s->x!=n2->x || s->y!=n2->y) {
      s = (TreeNode*)malloc(sizeof(TreeNode));
      s->mark = curr_mark;
      s->order = -1;
      s->id = n2->id;
      s->x = n2->x;
      s->y = n2->y;
      s->e = n2->e;
      if (s->e == n2) {
	s->e = s;
      }
      if (e == n2) {
	e = s;
      }
      s->len = n2->len;
      s->blen = n2->blen;
      n2->blen = 0;

      remove_child(n2->parent->children, n2);
      dl_append(TreeNode*, n2->parent->children, s);
      s->parent = n2->parent;
      n2->parent = s;
      s->children = dl_alloc();
      dl_append(TreeNode*, s->children, n2);
    }
    n2 = s;
  }

  if (n2ton1) {
    splice2(node, n2, e);
  } else {
    splice2(n2, node, e);
  }
}